

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrOriginFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNodePtr start;
  xmlXPathObjectPtr value;
  int error;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    if (ctxt->valueNr < ctxt->valueFrame) {
      error = 0x17;
    }
    else {
      start = ctxt->context->origin;
      if (start != (xmlNodePtr)0x0) {
        value = xmlXPtrNewLocationSetNodes(start,(xmlNodePtr)0x0);
        valuePush(ctxt,value);
        return;
      }
      error = 0x10;
    }
  }
  else {
    error = 0xc;
  }
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

static void
xmlXPtrOriginFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(0);

    if (ctxt->context->origin == NULL)
	XP_ERROR(XPTR_SYNTAX_ERROR);

    valuePush(ctxt, xmlXPtrNewLocationSetNodes(ctxt->context->origin, NULL));
}